

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

void crnd::crnd_free(void *p)

{
  void *p_local;
  
  if (p != (void *)0x0) {
    if (((ulong)p & 7) == 0) {
      (*(code *)g_pRealloc)(p,0,0,1,g_pUser_data);
    }
    else {
      crnd_mem_error("crnd_free: bad ptr");
    }
  }
  return;
}

Assistant:

void crnd_free(void* p)
    {
        if (!p)
            return;

        if ((uint32)reinterpret_cast<uintptr_t>(p) & (CRND_MIN_ALLOC_ALIGNMENT - 1))
        {
            crnd_mem_error("crnd_free: bad ptr");
            return;
        }

        (*g_pRealloc)(p, 0, NULL, true, g_pUser_data);
    }